

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_sync_receive_and_store_pdus(rtr_socket *rtr_socket)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pdu_router_key *ppVar4;
  pdu_aspa **pppVar5;
  pdu_aspa *__dest;
  pfx_table *pfx_table;
  undefined8 uVar6;
  size_t sVar7;
  spki_table *spki_table;
  aspa_table *aspa_table;
  aspa_table *ary;
  ulong uVar8;
  undefined8 uVar9;
  uint router_key_pdu_count;
  aspa_table *paVar10;
  rtr_socket_state new_state;
  rtr_socket *rtr_socket_00;
  uint *ind;
  uint *size;
  aspa_table *paVar11;
  size_t sVar12;
  long in_FS_OFFSET;
  long lStackY_20158;
  undefined1 uStackY_20150;
  char cStackY_2014f;
  uint uStackY_20148;
  undefined8 uStackY_10170;
  long lVar13;
  recv_loop_cleanup_args cleanup_args;
  int oldcancelstate;
  size_t aspa_pdus_count;
  pdu_aspa **aspa_pdus;
  pdu_router_key *router_key_pdus;
  uint ipv4_pdus_nindex;
  uint ipv4_pdus_size;
  pdu_ipv4 *ipv4_pdus;
  uint ipv6_pdus_size;
  uint ipv6_pdus_nindex;
  pdu_ipv6 *ipv6_pdus;
  pdu_end_of_data_v0 apStack_100a8 [5461];
  char txt [15];
  
  lVar13 = *(long *)(in_FS_OFFSET + 0x28);
  aspa_table = (aspa_table *)0x0;
  ary = (aspa_table *)&ipv6_pdus;
  ipv6_pdus = (pdu_ipv6 *)0x0;
  ipv6_pdus_nindex = 0;
  ipv6_pdus_size = 0;
  cleanup_args.ipv4_pdus = &ipv4_pdus;
  ipv4_pdus = (pdu_ipv4 *)0x0;
  ipv4_pdus_size = 0;
  ipv4_pdus_nindex = 0;
  cleanup_args.router_key_pdus = &router_key_pdus;
  router_key_pdus = (pdu_router_key *)0x0;
  cleanup_args.aspa_pdus = &aspa_pdus;
  aspa_pdus = (pdu_aspa **)0x0;
  cleanup_args.aspa_pdu_count = &aspa_pdus_count;
  aspa_pdus_count = 0;
  cleanup_args.ipv6_pdus = (pdu_ipv6 **)ary;
  iVar1 = __sigsetjmp(txt,0);
  if (iVar1 == 0) {
    paVar11 = aspa_table;
    paVar10 = aspa_table;
    do {
      router_key_pdu_count = (uint)aspa_table;
      __pthread_register_cancel((__pthread_unwind_buf_t *)txt);
      pthread_setcancelstate(0,&oldcancelstate);
      uVar2 = rtr_receive_pdu(rtr_socket,apStack_100a8,0x3c,(time_t)ary);
      spki_table = (spki_table *)(ulong)uVar2;
      pthread_setcancelstate(1,&oldcancelstate);
      __pthread_unregister_cancel((__pthread_unwind_buf_t *)txt);
      if (uVar2 == 0xfffffffe) goto LAB_0010a0ee;
      iVar1 = -1;
      if ((int)uVar2 < 0) goto LAB_0010a4a6;
      if (0xb < (ulong)apStack_100a8[0].type) {
switchD_00109f64_caseD_1:
        lrtr_dbg("RTR Socket: Received unexpected PDU (Type: %u)",(ulong)apStack_100a8[0].type);
        txt._0_6_ = (undefined6)
                    CONCAT44(apStack_100a8[0].len,
                             CONCAT22(apStack_100a8[0].session_id,
                                      CONCAT11(apStack_100a8[0].type,apStack_100a8[0].ver)));
        txt[6] = (char)(apStack_100a8[0].len >> 0x10);
        txt[7] = (char)(apStack_100a8[0].len >> 0x18);
        rtr_pdu_convert_header_byte_order(txt,TO_NETWORK_BYTE_ORDER);
        rtr_send_error_pdu(rtr_socket,txt,8,CORRUPT_DATA,
                           "Unexpected PDU received during data synchronisation",0x34);
        iVar1 = -1;
        goto LAB_0010a4a6;
      }
      ary = (aspa_table *)
            ((long)&switchD_00109f64::switchdataD_00114e7c +
            (long)(int)(&switchD_00109f64::switchdataD_00114e7c)[apStack_100a8[0].type]);
      switch(apStack_100a8[0].type) {
      case '\0':
        lrtr_dbg("RTR Socket: Ignoring Serial Notify");
        goto LAB_0010a0c1;
      default:
        goto switchD_00109f64_caseD_1;
      case '\x04':
        uVar2 = 0x14;
        ary = (aspa_table *)&ipv4_pdus;
        ind = &ipv4_pdus_nindex;
        size = &ipv4_pdus_size;
        break;
      case '\x06':
        uVar2 = 0x20;
        ary = (aspa_table *)&ipv6_pdus;
        ind = &ipv6_pdus_nindex;
        size = &ipv6_pdus_size;
        break;
      case '\a':
        lrtr_dbg("RTR Socket: EOD PDU received.");
        uVar8 = (ulong)rtr_socket->session_id;
        if (rtr_socket->session_id == (uint)apStack_100a8[0].session_id) {
          if ((1 < (byte)(apStack_100a8[0].ver - 1)) ||
             (rtr_socket->iv_mode == RTR_INTERVAL_MODE_IGNORE_ANY)) {
LAB_0010a255:
            if (rtr_socket->is_resetting == true) {
              lrtr_dbg("RTR Socket: Reset in progress creating shadow table for atomic reset");
              rtr_socket_00 = (rtr_socket *)0x50;
              pfx_table = (pfx_table *)lrtr_malloc(0x50);
              if (pfx_table == (pfx_table *)0x0) {
                rtr_sync_receive_and_store_pdus_cold_1();
                lVar13 = *(long *)(in_FS_OFFSET + 0x28);
                lrtr_get_monotonic_time(&lStackY_20158);
                sVar12 = ((ulong)rtr_socket_00->refresh_interval + rtr_socket_00->last_update) -
                         lStackY_20158;
                if ((long)sVar12 < 1) {
                  sVar12 = 0;
                }
                lrtr_dbg("RTR Socket: waiting %jd sec. till next sync",sVar12);
                iVar1 = rtr_receive_pdu(rtr_socket_00,&uStackY_20150,sVar12,uVar8);
                iVar3 = -1;
                if (iVar1 < 0) {
                  if (iVar1 == -2) {
                    iVar3 = 0;
                    lrtr_dbg("RTR Socket: Refresh interval expired");
                  }
                }
                else if (cStackY_2014f == '\0') {
                  iVar3 = 0;
                  lrtr_dbg("RTR Socket: Serial Notify received (%u)",(ulong)uStackY_20148);
                }
                if (*(long *)(in_FS_OFFSET + 0x28) != lVar13) {
                  __stack_chk_fail();
                }
                return iVar3;
              }
              pfx_table_init(pfx_table,(pfx_update_fp)0x0);
              iVar1 = pfx_table_copy_except_socket(rtr_socket->pfx_table,pfx_table,rtr_socket);
              if (iVar1 == 0) {
                spki_table = (spki_table *)lrtr_malloc(0x170);
                if (spki_table == (spki_table *)0x0) {
                  aspa_table = (aspa_table *)0x0;
                  lrtr_dbg("RTR Socket: Memory allocation for spki shadow table failed");
                  iVar1 = -1;
                  spki_table = (spki_table *)0x0;
                }
                else {
                  spki_table_init(spki_table,(spki_update_fp)0x0);
                  iVar1 = spki_table_copy_except_socket
                                    (rtr_socket->spki_table,spki_table,rtr_socket);
                  if (iVar1 == 0) {
                    aspa_table = (aspa_table *)lrtr_malloc(0x80);
                    if (aspa_table == (aspa_table *)0x0) {
                      aspa_table = (aspa_table *)0x0;
                      lrtr_dbg("RTR Socket: Memory allocation for aspa shadow table failed");
                      iVar1 = -1;
                    }
                    else {
                      aspa_table_init(aspa_table,(aspa_update_fp)0x0);
                      lrtr_dbg("RTR Socket: Shadow tables created");
                      uStackY_10170 = 0x10a662;
                      iVar3 = rtr_sync_update_tables
                                        (rtr_socket,pfx_table,spki_table,aspa_table,ipv4_pdus,
                                         ipv4_pdus_nindex,ipv6_pdus,ipv6_pdus_nindex,router_key_pdus
                                         ,router_key_pdu_count,aspa_pdus,aspa_pdus_count,
                                         apStack_100a8);
                      iVar1 = -1;
                      if (iVar3 == 0) {
                        lrtr_dbg("RTR Socket: Reset finished. Swapping new table in.");
                        pfx_table_swap(rtr_socket->pfx_table,pfx_table);
                        spki_table_swap(rtr_socket->spki_table,spki_table);
                        lrtr_dbg("RTR Socket: Replacing ASPA records");
                        aspa_table_src_replace
                                  (rtr_socket->aspa_table,aspa_table,rtr_socket,
                                   rtr_socket->aspa_table->update_fp != (aspa_update_fp)0x0,false);
                        if (rtr_socket->pfx_table->update_fp == (pfx_update_fp)0x0) {
                          lrtr_dbg("RTR Socket: No pfx update callback. Skipping diff");
                        }
                        else {
                          lrtr_dbg("RTR Socket: Calculating and notifying pfx diff");
                          pfx_table_notify_diff(rtr_socket->pfx_table,pfx_table,rtr_socket);
                        }
                        if (rtr_socket->spki_table->update_fp == (spki_update_fp)0x0) {
                          iVar1 = 0;
                          lrtr_dbg("RTR Socket: No spki update callback. Skipping diff");
                        }
                        else {
                          iVar1 = 0;
                          lrtr_dbg("RTR Socket: Calculating and notifying spki diff");
                          spki_table_notify_diff(rtr_socket->spki_table,spki_table,rtr_socket);
                        }
                      }
                    }
                  }
                  else {
                    lrtr_dbg("RTR Socket: Creation of spki shadow table failed");
                    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
                    iVar1 = -1;
                  }
                }
              }
              else {
                lrtr_dbg("RTR Socket: Creation of pfx shadow table failed");
                rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
                iVar1 = -1;
              }
              lrtr_dbg("RTR Socket: Freeing shadow tables.");
              pfx_table_free_without_notify(pfx_table);
              lrtr_free(pfx_table);
              if (spki_table != (spki_table *)0x0) {
                spki_table_free_without_notify(spki_table);
                lrtr_free(spki_table);
              }
              if (aspa_table != (aspa_table *)0x0) {
                aspa_table_free(aspa_table,false);
                lrtr_free(aspa_table);
              }
              rtr_socket->is_resetting = false;
            }
            else {
              uStackY_10170 = 0x10a4a0;
              iVar1 = rtr_sync_update_tables
                                (rtr_socket,rtr_socket->pfx_table,rtr_socket->spki_table,
                                 rtr_socket->aspa_table,ipv4_pdus,ipv4_pdus_nindex,ipv6_pdus,
                                 ipv6_pdus_nindex,router_key_pdus,router_key_pdu_count,aspa_pdus,
                                 aspa_pdus_count,apStack_100a8);
            }
            goto LAB_0010a4a6;
          }
          iVar1 = rtr_check_interval_option
                            (rtr_socket,rtr_socket->iv_mode,apStack_100a8[1].sn,
                             RTR_INTERVAL_TYPE_EXPIRATION);
          if (iVar1 == -1) {
            uVar8 = (ulong)apStack_100a8[1].sn;
            uVar9 = 600;
            uVar6 = 0x2a300;
          }
          else {
            iVar1 = rtr_check_interval_option
                              (rtr_socket,rtr_socket->iv_mode,apStack_100a8[1]._0_4_,
                               RTR_INTERVAL_TYPE_REFRESH);
            if (iVar1 == -1) {
              uVar8 = (ulong)(uint)apStack_100a8[1]._0_4_;
              uVar9 = 1;
              uVar6 = 0x15180;
            }
            else {
              iVar1 = rtr_check_interval_option
                                (rtr_socket,rtr_socket->iv_mode,apStack_100a8[1].len,
                                 RTR_INTERVAL_TYPE_RETRY);
              if (iVar1 != -1) {
                uVar8 = (ulong)rtr_socket->retry_interval;
                lrtr_dbg("RTR Socket: New interval values: expire_interval:%u, refresh_interval:%u, retry_interval:%u"
                         ,(ulong)rtr_socket->expire_interval,(ulong)rtr_socket->refresh_interval);
                goto LAB_0010a255;
              }
              uVar8 = (ulong)apStack_100a8[1].len;
              uVar9 = 1;
              uVar6 = 0x1c20;
            }
          }
          lrtr_dbg("RTR Socket: Received expiration value out of range. Was %u, must be between %u and %u."
                   ,uVar8,uVar9,uVar6);
          rtr_send_error_pdu(rtr_socket,apStack_100a8,0xffff,CORRUPT_DATA,
                             "Interval value out of range",0x1c);
        }
        else {
          snprintf(txt,0x43,"Expected session_id: %u, received session_id. %u in EOD PDU");
          sVar7 = strlen(txt);
          rtr_send_error_pdu_from_host
                    (rtr_socket,apStack_100a8,0xffff,CORRUPT_DATA,txt,(int)sVar7 + 1);
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        }
        iVar1 = -1;
        goto LAB_0010a4a6;
      case '\t':
        ppVar4 = router_key_pdus;
        if (router_key_pdu_count < (uint)paVar11) {
LAB_0010a024:
          router_key_pdus = ppVar4;
          memcpy(router_key_pdus + (long)aspa_table,apStack_100a8,0x7b);
          ary = aspa_table;
          aspa_table = (aspa_table *)(ulong)(router_key_pdu_count + 1);
          goto LAB_0010a0c1;
        }
        uVar2 = (uint)paVar11 + 100;
        paVar11 = (aspa_table *)(ulong)uVar2;
        ppVar4 = (pdu_router_key *)lrtr_realloc(router_key_pdus,(ulong)(uVar2 * 0x7b));
        if (ppVar4 != (pdu_router_key *)0x0) goto LAB_0010a024;
        builtin_strncpy(txt,"Realloc failed",0xf);
        lrtr_dbg("RTR Socket: %s");
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        goto LAB_0010a3ed;
      case '\n':
        iVar1 = -1;
        rtr_handle_error_pdu(rtr_socket,apStack_100a8);
        goto LAB_0010a4a6;
      case '\v':
        if (aspa_pdus_count < paVar10) {
LAB_0010a06d:
          sVar12 = (ulong)(ushort)apStack_100a8[0].sn._2_2_ * 4 + 0x10;
          __dest = (pdu_aspa *)lrtr_malloc(sVar12);
          if (__dest != (pdu_aspa *)0x0) {
            memcpy(__dest,apStack_100a8,sVar12);
            aspa_pdus[aspa_pdus_count] = __dest;
            aspa_pdus_count = aspa_pdus_count + 1;
            ary = (aspa_table *)aspa_pdus_count;
            goto LAB_0010a0c1;
          }
          builtin_strncpy(txt + 8,"ailed",6);
          uVar6 = 0x6620636f6c6c614d;
        }
        else {
          pppVar5 = (pdu_aspa **)lrtr_realloc(aspa_pdus,(long)paVar10 * 8 + 800);
          if (pppVar5 != (pdu_aspa **)0x0) {
            paVar10 = (aspa_table *)((paVar10->update_lock).__size + 0x2c);
            aspa_pdus = pppVar5;
            goto LAB_0010a06d;
          }
          builtin_strncpy(txt + 8,"failed",7);
          uVar6 = 0x20636f6c6c616552;
        }
        txt._0_6_ = (undefined6)uVar6;
        txt[6] = (char)((ulong)uVar6 >> 0x30);
        txt[7] = (char)((ulong)uVar6 >> 0x38);
        lrtr_dbg("RTR Socket: %s");
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        new_state = RTR_ERROR_FATAL;
        goto LAB_0010a445;
      }
      iVar1 = rtr_store_prefix_pdu(rtr_socket,apStack_100a8,uVar2,(void **)ary,ind,size);
      if (iVar1 == -1) {
LAB_0010a3ed:
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        iVar1 = -1;
        goto LAB_0010a4a6;
      }
LAB_0010a0c1:
      iVar1 = __sigsetjmp((__pthread_unwind_buf_t *)txt,0);
    } while (iVar1 == 0);
  }
  recv_loop_cleanup(&cleanup_args);
  __pthread_unwind_next((__pthread_unwind_buf_t *)txt);
LAB_0010a0ee:
  new_state = RTR_ERROR_TRANSPORT;
LAB_0010a445:
  rtr_change_socket_state(rtr_socket,new_state);
  iVar1 = -1;
LAB_0010a4a6:
  recv_loop_cleanup(&cleanup_args);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar13) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int rtr_sync_receive_and_store_pdus(struct rtr_socket *rtr_socket)
{
	char pdu_data[RTR_MAX_PDU_LEN];
	enum pdu_type type;
	int retval = RTR_SUCCESS;

	struct pdu_ipv6 *ipv6_pdus = NULL;
	unsigned int ipv6_pdus_nindex = 0; // next free index in ipv6_pdus
	unsigned int ipv6_pdus_size = 0;

	struct pdu_ipv4 *ipv4_pdus = NULL;
	unsigned int ipv4_pdus_size = 0;
	unsigned int ipv4_pdus_nindex = 0; // next free index in ipv4_pdus

	struct pdu_router_key *router_key_pdus = NULL;
	unsigned int router_key_pdus_size = 0;
	unsigned int router_key_pdus_nindex = 0;

	struct pdu_aspa **aspa_pdus = NULL;
	size_t aspa_pdus_capacity = 0;
	size_t aspa_pdus_count = 0;

	int oldcancelstate;
	struct recv_loop_cleanup_args cleanup_args = {.ipv4_pdus = &ipv4_pdus,
						      .ipv6_pdus = &ipv6_pdus,
						      .router_key_pdus = &router_key_pdus,
						      .aspa_pdus = &aspa_pdus,
						      .aspa_pdu_count = &aspa_pdus_count};

	// receive LRTR_IPV4/IPV6/ASPA PDUs till EOD
	do {
		pthread_cleanup_push(recv_loop_cleanup, &cleanup_args);
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);

		// Receive PDUs, cancellable
		retval = rtr_receive_pdu(rtr_socket, pdu_data, RTR_MAX_PDU_LEN, RTR_RECV_TIMEOUT);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		pthread_cleanup_pop(0);

		if (retval == TR_WOULDBLOCK) {
			rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			retval = RTR_ERROR;
			break;
		} else if (retval < 0) {
			retval = RTR_ERROR;
			break;
		}

		type = rtr_get_pdu_type(pdu_data);

		switch (type) {
		case SERIAL_NOTIFY:
			RTR_DBG1("Ignoring Serial Notify");
			break;

		case IPV4_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv4_pdus), (void **)&ipv4_pdus,
						 &ipv4_pdus_nindex, &ipv4_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case IPV6_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv6_pdus), (void **)&ipv6_pdus,
						 &ipv6_pdus_nindex, &ipv6_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ROUTER_KEY:
			// Temporarily store router key PDU, handle later after EOD PDU has been received
			if (rtr_store_router_key_pdu(rtr_socket, pdu_data, sizeof(*router_key_pdus), &router_key_pdus,
						     &router_key_pdus_nindex, &router_key_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ASPA:
			// Temporarily store ASPA PDU, handle later after EOD PDU has been received
			if (rtr_store_aspa_pdu(rtr_socket, (struct pdu_aspa *)pdu_data, &aspa_pdus, &aspa_pdus_count,
					       &aspa_pdus_capacity) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ERROR:
			rtr_handle_error_pdu(rtr_socket, pdu_data);
			retval = RTR_ERROR;
			break;

		case EOD:
			RTR_DBG1("EOD PDU received.");
			struct pdu_end_of_data_v0 *eod_pdu = (struct pdu_end_of_data_v0 *)pdu_data;

			retval = rtr_handle_eod_pdu(rtr_socket, eod_pdu, pdu_data);
			if (retval != RTR_SUCCESS)
				break;

			if (rtr_socket->is_resetting) {
				// Use table copies instead in order to perform an atomic update
				RTR_DBG1("Reset in progress creating shadow table for atomic reset");

				struct pfx_table *pfx_shadow_table = lrtr_malloc(sizeof(struct pfx_table));

				if (!pfx_shadow_table) {
					RTR_DBG1("Memory allocation for pfx shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				pfx_table_init(pfx_shadow_table, NULL);
				if (pfx_table_copy_except_socket(rtr_socket->pfx_table, pfx_shadow_table, rtr_socket) !=
				    PFX_SUCCESS) {
					RTR_DBG1("Creation of pfx shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct spki_table *spki_shadow_table = lrtr_malloc(sizeof(struct spki_table));

				if (!spki_shadow_table) {
					RTR_DBG1("Memory allocation for spki shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				spki_table_init(spki_shadow_table, NULL);
				if (spki_table_copy_except_socket(rtr_socket->spki_table, spki_shadow_table,
								  rtr_socket) != SPKI_SUCCESS) {
					RTR_DBG1("Creation of spki shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct aspa_table *aspa_shadow_table = lrtr_malloc(sizeof(struct aspa_table));

				if (!aspa_shadow_table) {
					RTR_DBG1("Memory allocation for aspa shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				aspa_table_init(aspa_shadow_table, NULL);

				RTR_DBG1("Shadow tables created");

				retval = rtr_sync_update_tables(rtr_socket, pfx_shadow_table, spki_shadow_table,
								aspa_shadow_table, ipv4_pdus, ipv4_pdus_nindex,
								ipv6_pdus, ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);

				if (retval == RTR_SUCCESS) {
					RTR_DBG1("Reset finished. Swapping new table in.");
					pfx_table_swap(rtr_socket->pfx_table, pfx_shadow_table);
					spki_table_swap(rtr_socket->spki_table, spki_shadow_table);

					// No need to notify shadow table's clients as it hasn't any.
					RTR_DBG1("Replacing ASPA records");
					aspa_table_src_replace(rtr_socket->aspa_table, aspa_shadow_table, rtr_socket,
							       !!rtr_socket->aspa_table->update_fp, false);

					if (rtr_socket->pfx_table->update_fp) {
						RTR_DBG1("Calculating and notifying pfx diff");
						pfx_table_notify_diff(rtr_socket->pfx_table, pfx_shadow_table,
								      rtr_socket);
					} else {
						RTR_DBG1("No pfx update callback. Skipping diff");
					}

					if (rtr_socket->spki_table->update_fp) {
						RTR_DBG1("Calculating and notifying spki diff");
						spki_table_notify_diff(rtr_socket->spki_table, spki_shadow_table,
								       rtr_socket);
					} else {
						RTR_DBG1("No spki update callback. Skipping diff");
					}
				}

			cleanup:
				RTR_DBG1("Freeing shadow tables.");
				if (pfx_shadow_table) {
					pfx_table_free_without_notify(pfx_shadow_table);
					lrtr_free(pfx_shadow_table);
				}

				if (spki_shadow_table) {
					spki_table_free_without_notify(spki_shadow_table);
					lrtr_free(spki_shadow_table);
				}

				if (aspa_shadow_table) {
					aspa_table_free(aspa_shadow_table, false);
					lrtr_free(aspa_shadow_table);
				}

				rtr_socket->is_resetting = false;
			} else {
				retval = rtr_sync_update_tables(rtr_socket, rtr_socket->pfx_table,
								rtr_socket->spki_table, rtr_socket->aspa_table,
								ipv4_pdus, ipv4_pdus_nindex, ipv6_pdus,
								ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);
			}

			break;

		default:
			RTR_DBG("Received unexpected PDU (Type: %u)", ((struct pdu_header *)pdu_data)->type);
			const char txt[] = "Unexpected PDU received during data synchronisation";

			rtr_send_error_pdu_from_host(rtr_socket, pdu_data, sizeof(struct pdu_header), CORRUPT_DATA, txt,
						     sizeof(txt));
			retval = RTR_ERROR;
			break;
		}
	} while (type != EOD && retval != RTR_ERROR);

	recv_loop_cleanup(&cleanup_args);
	return retval;
}